

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Geometry.cpp
# Opt level: O0

void __thiscall amrex::Geometry::computeRoundoffDomain(Geometry *this)

{
  longdouble x;
  int iVar1;
  int iVar2;
  int iVar3;
  Box *pBVar4;
  double *pdVar5;
  Geometry *in_RDI;
  Geometry *this_00;
  literals *plVar6;
  float fVar7;
  Real RVar8;
  Real tol;
  Real RVar9;
  double dVar10;
  Real dtol;
  Real ftol;
  Real deltax;
  Real idx;
  Real phi;
  Real plo;
  int ihi;
  int ilo;
  int idim;
  int k;
  int in_stack_ffffffffffffff5c;
  undefined2 in_stack_ffffffffffffff60;
  undefined6 in_stack_ffffffffffffff62;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  Real local_50;
  int ilo_00;
  Geometry *plo_00;
  undefined4 in_stack_ffffffffffffffe0;
  
  plo_00 = in_RDI;
  for (ilo_00 = 0; ilo_00 < 3; ilo_00 = ilo_00 + 1) {
    RVar8 = RealBox::lo(&in_RDI->prob_domain,ilo_00);
    (in_RDI->super_CoordSys).offset[ilo_00] = RVar8;
    RVar8 = RealBox::length(&in_RDI->prob_domain,ilo_00);
    plVar6 = (literals *)&in_RDI->domain;
    iVar1 = Box::length((Box *)plVar6,ilo_00);
    (in_RDI->super_CoordSys).dx[ilo_00] = RVar8 / (double)iVar1;
    x = (longdouble)1;
    in_stack_ffffffffffffff5c = (int)((unkuint10)x >> 0x20);
    in_stack_ffffffffffffff60 = (undefined2)((unkuint10)x >> 0x40);
    RVar8 = literals::operator____rt(plVar6,x);
    (in_RDI->super_CoordSys).inv_dx[ilo_00] = RVar8 / (in_RDI->super_CoordSys).dx[ilo_00];
  }
  for (iVar1 = 0; iVar1 < 3; iVar1 = iVar1 + 1) {
    pBVar4 = Domain(in_RDI);
    iVar2 = Box::smallEnd(pBVar4,iVar1);
    pBVar4 = Domain(in_RDI);
    iVar3 = Box::bigEnd(pBVar4,iVar1);
    RVar8 = ProbLo((Geometry *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                   in_stack_ffffffffffffff5c);
    tol = ProbHi((Geometry *)CONCAT62(in_stack_ffffffffffffff62,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
    local_50 = CoordSys::InvCellSize(&in_RDI->super_CoordSys,iVar1);
    this_00 = in_RDI;
    local_58 = CoordSys::CellSize(&in_RDI->super_CoordSys,iVar1);
    RVar9 = literals::operator____rt((literals *)this_00,_DAT_0194ff80);
    local_68 = RVar9 * local_58;
    RVar9 = literals::operator____rt((literals *)this_00,_DAT_0196a2f0);
    local_70 = RVar9 * tol;
    plVar6 = (literals *)&local_68;
    pdVar5 = std::max<double>((double *)plVar6,&local_70);
    local_60 = *pdVar5;
    RVar9 = literals::operator____rt(plVar6,_DAT_01969ad0);
    local_80 = RVar9 * local_58;
    in_stack_ffffffffffffff5c = (int)((unkuint10)_DAT_0196a2e0 >> 0x20);
    in_stack_ffffffffffffff60 = (undefined2)((unkuint10)_DAT_0196a2e0 >> 0x40);
    RVar9 = literals::operator____rt(plVar6,_DAT_0196a2e0);
    local_88 = RVar9 * tol;
    pdVar5 = std::max<double>(&local_80,&local_88);
    local_78 = *pdVar5;
    fVar7 = detail::bisect_prob_hi<float>
                      ((Real)plo_00,(Real)CONCAT44(ilo_00,iVar1),(Real)CONCAT44(iVar2,iVar3),
                       (int)((ulong)RVar8 >> 0x20),SUB84(RVar8,0),tol);
    (in_RDI->roundoff_hi_f).arr[iVar1] = fVar7;
    dVar10 = detail::bisect_prob_hi<double>
                       ((Real)&in_RDI->roundoff_hi_f,(Real)CONCAT44(iVar1,in_stack_ffffffffffffffe0)
                        ,(Real)plo_00,ilo_00,iVar1,(Real)CONCAT44(iVar2,iVar3));
    (in_RDI->roundoff_hi_d).arr[iVar1] = dVar10;
  }
  return;
}

Assistant:

void
Geometry::computeRoundoffDomain ()
{
    for (int k = 0; k < AMREX_SPACEDIM; k++)
    {
        offset[k] = prob_domain.lo(k);
        dx[k] = prob_domain.length(k)/(Real(domain.length(k)));
        inv_dx[k] = 1.0_rt/dx[k];
    }

    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim)
    {
        int ilo = Domain().smallEnd(idim);
        int ihi = Domain().bigEnd(idim);
        Real plo = ProbLo(idim);
        Real phi = ProbHi(idim);
        Real idx = InvCellSize(idim);
        Real deltax = CellSize(idim);

        Real ftol = std::max(1.e-4_rt*deltax, 2.e-7_rt*phi);
        Real dtol = std::max(1.e-8_rt*deltax, 1.e-14_rt*phi);

        roundoff_hi_f[idim] = detail::bisect_prob_hi<float> (plo, phi, idx, ilo, ihi, ftol);
        roundoff_hi_d[idim] = detail::bisect_prob_hi<double>(plo, phi, idx, ilo, ihi, dtol);
    }
}